

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O3

Am_Object Am_Create_Search_Dialog_For(Am_Object *main_undo_handler)

{
  Am_Slot_Key AVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Value_List *list;
  Am_Wrapper *pAVar4;
  Am_Object *pAVar5;
  int iVar6;
  Am_Object *in_RSI;
  int current_y;
  Am_Value_List pos_slots;
  Am_Value a;
  Am_Value_List all_slots;
  Am_Object group;
  Am_Value_List slots_to_item;
  Am_Assoc as;
  Am_Object proto;
  Am_Value_List color_slots;
  Am_Value_List slots_values;
  Am_Value v;
  Am_Value_List all_types;
  Am_Value_List local_all_slots;
  Am_Value_List local_118;
  Am_Object_Data *local_108;
  Am_Value_List local_100;
  Am_Value local_f0;
  Am_Value_List local_e0;
  Am_Value local_d0;
  Am_Value_List local_c0;
  Am_Assoc local_b0;
  Am_Object local_a8;
  Am_Value_List local_a0;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Value_List local_78;
  Am_Value local_68;
  Am_Value_List local_58;
  Am_Object *local_48;
  Am_Value_List local_40;
  
  local_108 = (Am_Object_Data *)main_undo_handler;
  Am_Object::Create(main_undo_handler,(char *)&Am_Search_Window);
  Am_Value_List::Am_Value_List(&local_e0);
  local_a8.data = (Am_Object_Data *)0x0;
  local_b0.data = (Am_Assoc_Data *)0x0;
  Am_Value_List::Am_Value_List(&local_40);
  Am_Value_List::Am_Value_List(&local_58);
  Am_Value_List::Am_Value_List(&local_78);
  local_68.type = 0;
  local_68.value.wrapper_value = (Am_Wrapper *)0x0;
  local_48 = in_RSI;
  Am_Value_List::Start(&am_all_proto_names);
  while( true ) {
    bVar2 = Am_Value_List::Last(&am_all_proto_names);
    if (bVar2) {
      Am_Value_List::Am_Value_List(&local_100);
      local_f0.type = 0;
      local_f0.value.wrapper_value = (Am_Wrapper *)0x0;
      am_check_list_slot(100,&local_f0,&Am_No_Object,&local_e0,&local_100);
      am_check_list_slot(0x65,&local_f0,&Am_No_Object,&local_e0,&local_100);
      am_check_list_slot(0x66,&local_f0,&Am_No_Object,&local_e0,&local_100);
      am_check_list_slot(0x67,&local_f0,&Am_No_Object,&local_e0,&local_100);
      am_check_list_slot(0x8b,&local_f0,&Am_No_Object,&local_e0,&local_100);
      am_check_list_slot(0x8c,&local_f0,&Am_No_Object,&local_e0,&local_100);
      am_check_list_slot(0x8d,&local_f0,&Am_No_Object,&local_e0,&local_100);
      am_check_list_slot(0x8e,&local_f0,&Am_No_Object,&local_e0,&local_100);
      Am_Value_List::Am_Value_List(&local_a0);
      am_check_list_slot(0x6a,&local_f0,&Am_No_Object,&local_e0,&local_a0);
      am_check_list_slot(0x6b,&local_f0,&Am_No_Object,&local_e0,&local_a0);
      Am_Object::Get_Object((Am_Object *)&local_c0,(Am_Slot_Key)local_108,(ulong)Am_TYPE_USE_ITEM);
      pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_58);
      Am_Object::Set((Am_Object *)&local_c0,0xa2,pAVar4,0);
      Am_Object::~Am_Object((Am_Object *)&local_c0);
      Am_Value_List::Am_Value_List(&local_c0);
      local_d0.type = 0x4015;
      local_d0.value.long_value = 0xb;
      Am_Object::Get_Object
                ((Am_Object *)&local_118.item,(Am_Slot_Key)local_108,(ulong)Am_TYPE_USE_ITEM);
      pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&local_118.item);
      Am_Assoc::Am_Assoc((Am_Assoc *)&local_118,&local_d0,pAVar4);
      pAVar4 = Am_Assoc::operator_cast_to_Am_Wrapper_((Am_Assoc *)&local_118);
      Am_Value_List::Add(&local_c0,pAVar4,Am_TAIL,true);
      Am_Assoc::~Am_Assoc((Am_Assoc *)&local_118);
      Am_Object::~Am_Object((Am_Object *)&local_118.item);
      Am_Value::~Am_Value(&local_d0);
      local_d0.type = 0;
      local_d0._2_6_ = 0;
      local_118.item._0_4_ = 0x88;
      bVar2 = Am_Value_List::Valid(&local_100);
      iVar6 = 0x8d;
      if (bVar2) {
        generate_search_group
                  (&local_118,(char *)&local_100,(int *)0x288071,(bool)((char)&local_118 + '\b'),
                   (Am_Value_List *)0x0,&local_c0);
        Am_Object::operator=((Am_Object *)&local_d0,(Am_Object *)&local_118);
        Am_Object::~Am_Object((Am_Object *)&local_118);
        Am_Object::Am_Object(&local_80,(Am_Object *)&local_d0);
        Am_Object::Add_Part((Am_Object *)local_108,&local_80,true,0);
        Am_Object::~Am_Object(&local_80);
        iVar6 = (int)local_118.item + 5;
      }
      local_118.item._0_4_ = iVar6;
      bVar2 = Am_Value_List::Valid(&local_a0);
      if (bVar2) {
        generate_search_group
                  (&local_118,(char *)&local_a0,(int *)"Colors",(bool)((char)&local_118 + '\b'),
                   (Am_Value_List *)0x0,&local_c0);
        Am_Object::operator=((Am_Object *)&local_d0,(Am_Object *)&local_118);
        Am_Object::~Am_Object((Am_Object *)&local_118);
        Am_Object::Am_Object(&local_88,(Am_Object *)&local_d0);
        Am_Object::Add_Part((Am_Object *)local_108,&local_88,true,0);
        Am_Object::~Am_Object(&local_88);
        iVar6 = (int)local_118.item;
      }
      local_118.item._0_4_ = iVar6 + 5;
      bVar2 = Am_Value_List::Valid(&local_e0);
      iVar6 = iVar6 + 5;
      if (bVar2) {
        generate_search_group
                  (&local_118,(char *)&local_e0,(int *)"Other",(bool)((char)&local_118 + '\b'),
                   (Am_Value_List *)0x0,&local_c0);
        Am_Object::operator=((Am_Object *)&local_d0,(Am_Object *)&local_118);
        Am_Object::~Am_Object((Am_Object *)&local_118);
        Am_Object::Am_Object(&local_90,(Am_Object *)&local_d0);
        Am_Object::Add_Part((Am_Object *)local_108,&local_90,true,0);
        Am_Object::~Am_Object(&local_90);
        iVar6 = (int)local_118.item;
      }
      local_118.item._0_4_ = iVar6 + 5;
      add_bottom_part((Am_Object *)local_108,(int *)&local_118.item);
      Am_Object::Set((Am_Object *)local_108,0x67,(int)local_118.item,0);
      AVar1 = Am_SLOTS_TO_ITEMS;
      pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_c0);
      Am_Object::Set((Am_Object *)local_108,AVar1,pAVar4,0);
      pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(local_48);
      Am_Object::Set((Am_Object *)local_108,0x174,pAVar4,0);
      bVar2 = Am_Object::Valid(local_48);
      AVar1 = Am_SEARCH_DIALOG;
      if (bVar2) {
        pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)local_108);
        Am_Object::Set(local_48,AVar1,pAVar4,1);
      }
      Am_Object::~Am_Object((Am_Object *)&local_d0);
      Am_Value_List::~Am_Value_List(&local_c0);
      Am_Value_List::~Am_Value_List(&local_a0);
      Am_Value::~Am_Value(&local_f0);
      Am_Value_List::~Am_Value_List(&local_100);
      Am_Value::~Am_Value(&local_68);
      Am_Value_List::~Am_Value_List(&local_78);
      Am_Value_List::~Am_Value_List(&local_58);
      Am_Value_List::~Am_Value_List(&local_40);
      Am_Assoc::~Am_Assoc(&local_b0);
      Am_Object::~Am_Object(&local_a8);
      Am_Value_List::~Am_Value_List(&local_e0);
      return (Am_Object)local_108;
    }
    pAVar3 = Am_Value_List::Get(&am_all_proto_names);
    Am_Assoc::operator=(&local_b0,pAVar3);
    if (local_b0.data == (Am_Assoc_Data *)0x0) break;
    Am_Value::Am_Value((Am_Value *)&local_100,&(local_b0.data)->value_2);
    Am_Object::operator=(&local_a8,(Am_Value *)&local_100);
    Am_Value::~Am_Value((Am_Value *)&local_100);
    pAVar3 = Am_Object::Get(&local_a8,0xb8,0);
    Am_Value_List::operator=(&local_40,pAVar3);
    list = Am_Value_List::Append_New(&local_e0,&local_40,true);
    Am_Value_List::operator=(&local_e0,list);
    Am_Value_List::Start(&local_40);
    while( true ) {
      bVar2 = Am_Value_List::Last(&local_40);
      if (bVar2) break;
      pAVar3 = Am_Value_List::Get(&local_40);
      Am_Am_Slot_Key::Am_Am_Slot_Key((Am_Am_Slot_Key *)&local_a0,pAVar3);
      local_f0.value.long_value._2_6_ = 0;
      local_f0.value.long_value._0_2_ = (ushort)local_a0.data;
      local_f0.type = 0x4015;
      Am_Value_List::Assoc_2(&local_100,(Am_Value *)&local_78);
      bVar2 = Am_Value::Exists((Am_Value *)&local_100);
      Am_Value::~Am_Value((Am_Value *)&local_100);
      Am_Value::~Am_Value(&local_f0);
      if (!bVar2) {
        pAVar3 = Am_Object::Get(&local_a8,(ushort)local_a0.data,1);
        Am_Value::operator=(&local_68,pAVar3);
        bVar2 = Am_Value::Exists(&local_68);
        if (!bVar2) {
          Am_Value::operator=(&local_68,0);
        }
        local_100.item = (Am_List_Item *)(ulong)(ushort)local_a0.data;
        local_100.data._0_2_ = 0x4015;
        Am_Assoc::Am_Assoc((Am_Assoc *)&local_f0,(Am_Value *)&local_100,&local_68);
        pAVar4 = Am_Assoc::operator_cast_to_Am_Wrapper_((Am_Assoc *)&local_f0);
        Am_Value_List::Add(&local_78,pAVar4,Am_TAIL,true);
        Am_Assoc::~Am_Assoc((Am_Assoc *)&local_f0);
        Am_Value::~Am_Value((Am_Value *)&local_100);
      }
      Am_Value_List::Next(&local_40);
    }
    Am_Object::Create((Am_Object *)&local_f0,(char *)&Am_Command);
    pAVar5 = Am_Object::Set((Am_Object *)&local_f0,0xca,new_item_value.from_wrapper,0);
    if (local_b0.data == (Am_Assoc_Data *)0x0) {
      Am_Error("Accessing (nullptr) Assoc");
    }
    Am_Value::Am_Value((Am_Value *)&local_100,&(local_b0.data)->value_1);
    pAVar5 = Am_Object::Set(pAVar5,0x150,(Am_Value *)&local_100,0);
    pAVar5 = Am_Object::Set(pAVar5,0x154,-1,0);
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_a8);
    pAVar5 = Am_Object::Set(pAVar5,0x153,pAVar4,0);
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar5);
    Am_Value_List::Add(&local_58,pAVar4,Am_TAIL,true);
    Am_Value::~Am_Value((Am_Value *)&local_100);
    Am_Object::~Am_Object((Am_Object *)&local_f0);
    Am_Value_List::Next(&am_all_proto_names);
  }
  Am_Error("Accessing (nullptr) Assoc");
}

Assistant:

Am_Object
Am_Create_Search_Dialog_For(/* Am_Load_Save_Context& ls_context, */
                            Am_Object &main_undo_handler)
{
  Am_Object this_search_window = Am_Search_Window.Create();
  Am_Value_List all_slots;
  Am_Object proto;
  Am_Assoc as;
  Am_Value_List local_all_slots;
  Am_Value_List all_types;
  Am_Value_List slots_values;
  Am_Value v;
  for (am_all_proto_names.Start(); !am_all_proto_names.Last();
       am_all_proto_names.Next()) {
    as = am_all_proto_names.Get();
    proto = as.Value_2();
    local_all_slots = proto.Get(Am_SLOTS_TO_SAVE);
    all_slots = all_slots.Append_New(local_all_slots);
    for (local_all_slots.Start(); !local_all_slots.Last();
         local_all_slots.Next()) {
      Am_Am_Slot_Key this_slot = local_all_slots.Get();
      if (!(slots_values.Assoc_2(this_slot).Exists())) {
        v = proto.Get(this_slot, Am_OK_IF_NOT_THERE);
        if (!v.Exists())
          v = 0;
        slots_values.Add(Am_Assoc(this_slot, v));
      }
    }

    all_types.Add(Am_Command.Create()
                      .Set(Am_DO_METHOD, new_item_value)
                      .Set(Am_LABEL, as.Value_1())
                      .Set(Am_IMPLEMENTATION_PARENT, Am_NOT_USUALLY_UNDONE)
                      .Set(Am_ID, proto));
  }
  Am_Value_List pos_slots;
  Am_Value a;
  am_check_list_slot(Am_LEFT, a, Am_No_Object, all_slots, pos_slots);
  am_check_list_slot(Am_TOP, a, Am_No_Object, all_slots, pos_slots);
  am_check_list_slot(Am_WIDTH, a, Am_No_Object, all_slots, pos_slots);
  am_check_list_slot(Am_HEIGHT, a, Am_No_Object, all_slots, pos_slots);
  am_check_list_slot(Am_X1, a, Am_No_Object, all_slots, pos_slots);
  am_check_list_slot(Am_Y1, a, Am_No_Object, all_slots, pos_slots);
  am_check_list_slot(Am_X2, a, Am_No_Object, all_slots, pos_slots);
  am_check_list_slot(Am_Y2, a, Am_No_Object, all_slots, pos_slots);
  Am_Value_List color_slots;
  am_check_list_slot(Am_FILL_STYLE, a, Am_No_Object, all_slots, color_slots);
  am_check_list_slot(Am_LINE_STYLE, a, Am_No_Object, all_slots, color_slots);

  this_search_window.Get_Object(Am_TYPE_USE_ITEM).Set(Am_ITEMS, all_types);
  Am_Value_List slots_to_item;
  slots_to_item.Add(Am_Assoc(Am_Am_Slot_Key(Am_PROTOTYPE),
                             this_search_window.Get_Object(Am_TYPE_USE_ITEM)));

  Am_Object group;

  int current_y = 136;
  //  Generate the location section
  if (pos_slots.Valid()) {
    group = generate_search_group(pos_slots, "Location", current_y, false,
                                  slots_to_item, slots_values);
    this_search_window.Add_Part(group);
  }
  current_y += OFFSET;

  //  Generate the color section
  if (color_slots.Valid()) {
    group = generate_search_group(color_slots, "Colors", current_y, false,
                                  slots_to_item, slots_values);
    this_search_window.Add_Part(group);
  }
  current_y += OFFSET;

  //  Generate the "other" section
  if (all_slots.Valid()) {
    group = generate_search_group(all_slots, "Other", current_y, false,
                                  slots_to_item, slots_values);
    this_search_window.Add_Part(group);
  }
  current_y += OFFSET;
  add_bottom_part(this_search_window, current_y);
  this_search_window.Set(Am_HEIGHT, current_y);
  this_search_window.Set(Am_SLOTS_TO_ITEMS, slots_to_item);
  this_search_window.Set(Am_UNDO_HANDLER, main_undo_handler);
  if (main_undo_handler.Valid())
    main_undo_handler.Set(Am_SEARCH_DIALOG, this_search_window,
                          Am_OK_IF_NOT_THERE);
  return this_search_window;
}